

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderDiscardTests.cpp
# Opt level: O0

void deqp::gles2::Functional::evalDiscardNever(ShaderEvalContext *c)

{
  VecAccess<float,_4,_3> local_38;
  undefined1 local_1c [20];
  ShaderEvalContext *c_local;
  
  local_1c._12_8_ = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_1c,(int)c,0,1);
  tcu::Vector<float,_4>::xyz(&local_38,(Vec4 *)(local_1c._12_8_ + 0x1f0));
  tcu::VecAccess<float,_4,_3>::operator=(&local_38,(Vector<float,_3> *)local_1c);
  return;
}

Assistant:

inline void evalDiscardNever	(ShaderEvalContext& c) { c.color.xyz() = c.coords.swizzle(0,1,2); }